

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phf.cc
# Opt level: O1

int PHF::init<phf_string,false>(phf *phf,phf_string *k,size_t n,size_t l,size_t a,phf_seed_t seed)

{
  long *plVar1;
  ulong *puVar2;
  int iVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  byte bVar8;
  undefined1 auVar9 [12];
  size_t __nmemb;
  size_t sVar10;
  undefined8 *__base;
  void *__ptr;
  uint32_t *puVar11;
  ulong uVar12;
  ulong uVar13;
  int *piVar14;
  uint32_t uVar15;
  ulong uVar16;
  size_t sVar17;
  undefined8 *puVar18;
  ulong uVar19;
  uint *puVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  uint uVar25;
  uint uVar26;
  size_t sVar27;
  uint uVar28;
  uint uVar29;
  undefined8 *puVar30;
  undefined8 *puVar31;
  undefined8 *puVar32;
  size_t __nmemb_00;
  void *local_50;
  
  __nmemb_00 = n + (n == 0);
  uVar16 = l + (l == 0);
  sVar10 = 100;
  if (a < 100) {
    sVar10 = a;
  }
  phf->nodiv = false;
  __nmemb = phf_primeup(((uVar16 + __nmemb_00) - 1) / uVar16);
  sVar10 = phf_primeup((__nmemb_00 * 100) / (sVar10 + (sVar10 == 0)));
  if (sVar10 == 0 || __nmemb == 0) {
    return 0x22;
  }
  __base = (undefined8 *)calloc(__nmemb_00,0x20);
  if ((__base == (undefined8 *)0x0) || (local_50 = calloc(__nmemb,8), local_50 == (void *)0x0)) {
    __ptr = (void *)0x0;
    local_50 = (void *)0x0;
  }
  else {
    if (n != 0) {
      sVar17 = 0;
LAB_00117a45:
      puVar20 = (uint *)k[sVar17].p;
      sVar27 = k[sVar17].n;
      uVar28 = seed;
      do {
        uVar29 = 0;
        uVar25 = 0;
        switch(sVar27) {
        case 0:
          goto switchD_00117aa8_caseD_0;
        case 3:
          uVar25 = (uint)*(byte *)((long)puVar20 + 2) << 8;
        case 2:
          uVar29 = uVar25 | (uint)*(byte *)((long)puVar20 + 1) << 0x10;
        case 1:
          uVar28 = (((uint)(byte)*puVar20 << 0x18 | uVar29) * -0x3361d2af >> 0x11 |
                   uVar29 * 0x16a88000) * 0x1b873593 ^ uVar28;
          uVar28 = (uVar28 << 0xd | uVar28 >> 0x13) * 5 + 0xe6546b64;
          goto switchD_00117aa8_caseD_0;
        default:
          uVar25 = *puVar20;
          uVar29 = uVar25 >> 0x18 | (uVar25 & 0xff0000) >> 8 | (uVar25 & 0xff00) << 8;
          uVar28 = ((uVar29 | uVar25 << 0x18) * -0x3361d2af >> 0x11 | uVar29 * 0x16a88000) *
                   0x1b873593 ^ uVar28;
          uVar28 = (uVar28 << 0xd | uVar28 >> 0x13) * 5 + 0xe6546b64;
          puVar20 = puVar20 + 1;
          sVar27 = sVar27 - 4;
        }
      } while( true );
    }
LAB_00117b4b:
    qsort(__base,__nmemb_00,0x20,phf_keycmp<phf_string>);
    uVar16 = sVar10 + 0x3f >> 6;
    __ptr = calloc(uVar16 * 2,8);
    if (__ptr == (void *)0x0) {
      __ptr = (void *)0x0;
    }
    else {
      puVar11 = (uint32_t *)calloc(__nmemb,4);
      if (puVar11 != (uint32_t *)0x0) {
        iVar3 = 0;
        if ((long)n < 1) {
          uVar13 = 0;
        }
        else {
          uVar13 = 0;
          puVar18 = __base;
          do {
            lVar24 = *(long *)puVar18[3];
            if (lVar24 == 0) break;
            puVar32 = puVar18 + lVar24 * 4;
            uVar19 = 1;
            if (0 < lVar24) {
LAB_00117c1b:
              uVar28 = ((uint)((int)uVar19 * -0x3361d2af) >> 0x11 | (int)uVar19 * 0x16a88000) *
                       0x1b873593 ^ seed;
              uVar28 = (uVar28 << 0xd | uVar28 >> 0x13) * 5 + 0xe6546b64;
              puVar30 = puVar18;
LAB_00117c4b:
              puVar20 = (uint *)*puVar30;
              lVar21 = puVar30[1];
              uVar25 = uVar28;
              do {
                uVar26 = 0;
                uVar29 = 0;
                switch(lVar21) {
                case 0:
                  goto switchD_00117c9a_caseD_0;
                case 3:
                  uVar29 = (uint)*(byte *)((long)puVar20 + 2) << 8;
                case 2:
                  uVar26 = uVar29 | (uint)*(byte *)((long)puVar20 + 1) << 0x10;
                case 1:
                  uVar25 = (((uint)(byte)*puVar20 << 0x18 | uVar26) * -0x3361d2af >> 0x11 |
                           uVar26 * 0x16a88000) * 0x1b873593 ^ uVar25;
                  uVar25 = (uVar25 << 0xd | uVar25 >> 0x13) * 5 + 0xe6546b64;
                  goto switchD_00117c9a_caseD_0;
                default:
                  uVar29 = *puVar20;
                  uVar26 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
                  uVar25 = ((uVar26 | uVar29 << 0x18) * -0x3361d2af >> 0x11 | uVar26 * 0x16a88000) *
                           0x1b873593 ^ uVar25;
                  uVar25 = (uVar25 << 0xd | uVar25 >> 0x13) * 5 + 0xe6546b64;
                  puVar20 = puVar20 + 1;
                  lVar21 = lVar21 + -4;
                }
              } while( true );
            }
LAB_00117e31:
            uVar15 = (uint32_t)uVar19;
            if (0 < lVar24) {
              uVar28 = (uVar15 * -0x3361d2af >> 0x11 | uVar15 * 0x16a88000) * 0x1b873593 ^ seed;
              puVar30 = puVar18;
LAB_00117e6e:
              puVar20 = (uint *)*puVar30;
              lVar24 = puVar30[1];
              uVar25 = uVar28 << 0xd | uVar28 >> 0x13;
              do {
                uVar25 = uVar25 * 5 + 0xe6546b64;
                uVar26 = 0;
                uVar29 = 0;
                switch(lVar24) {
                case 0:
                  goto switchD_00117ebd_caseD_0;
                case 3:
                  uVar29 = (uint)*(byte *)((long)puVar20 + 2) << 8;
                case 2:
                  uVar26 = uVar29 | (uint)*(byte *)((long)puVar20 + 1) << 0x10;
                case 1:
                  uVar25 = (((uint)(byte)*puVar20 << 0x18 | uVar26) * -0x3361d2af >> 0x11 |
                           uVar26 * 0x16a88000) * 0x1b873593 ^ uVar25;
                  uVar25 = (uVar25 << 0xd | uVar25 >> 0x13) * 5 + 0xe6546b64;
                  goto switchD_00117ebd_caseD_0;
                default:
                  uVar29 = *puVar20;
                  uVar26 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
                  uVar25 = ((uVar26 | uVar29 << 0x18) * -0x3361d2af >> 0x11 | uVar26 * 0x16a88000) *
                           0x1b873593 ^ uVar25;
                  uVar25 = uVar25 << 0xd | uVar25 >> 0x13;
                  puVar20 = puVar20 + 1;
                  lVar24 = lVar24 + -4;
                }
              } while( true );
            }
LAB_00117f41:
            uVar13 = uVar13 & 0xffffffff;
            if (uVar13 < uVar19) {
              uVar13 = uVar19;
            }
            puVar11[*(uint *)(puVar18 + 2)] = uVar15;
            puVar18 = puVar32;
          } while (puVar32 < __base + n * 4);
          uVar13 = uVar13 & 0xffffffff;
        }
        phf->seed = seed;
        phf->r = __nmemb;
        phf->m = sVar10;
        phf->g = puVar11;
        phf->d_max = uVar13;
        phf->g_op = PHF_G_UINT32_MOD_R;
        phf->g_jmp = (void *)0x0;
        goto LAB_00117f8a;
      }
    }
  }
  piVar14 = __errno_location();
  iVar3 = *piVar14;
LAB_00117f8a:
  free(__ptr);
  free(local_50);
  free(__base);
  return iVar3;
switchD_00117aa8_caseD_0:
  uVar28 = (uVar28 >> 0x10 ^ uVar28) * -0x7a143595;
  uVar28 = (uVar28 >> 0xd ^ uVar28) * -0x3d4d51cb;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = __nmemb;
  auVar9._4_8_ = 0;
  auVar9._0_4_ = uVar28 >> 0x10 ^ uVar28;
  lVar24 = SUB128(auVar9 % auVar4,0);
  sVar27 = k[sVar17].n;
  __base[sVar17 * 4] = k[sVar17].p;
  (__base + sVar17 * 4)[1] = sVar27;
  *(int *)(__base + sVar17 * 4 + 2) = SUB124(auVar9 % auVar4,0);
  plVar1 = (long *)((long)local_50 + lVar24 * 8);
  *plVar1 = *plVar1 + 1;
  __base[sVar17 * 4 + 3] = (void *)((long)local_50 + lVar24 * 8);
  sVar17 = sVar17 + 1;
  if (sVar17 == n) goto LAB_00117b4b;
  goto LAB_00117a45;
switchD_00117c9a_caseD_0:
  uVar25 = (uVar25 >> 0x10 ^ uVar25) * -0x7a143595;
  uVar25 = (uVar25 >> 0xd ^ uVar25) * -0x3d4d51cb;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = sVar10;
  auVar5 = ZEXT416(uVar25 >> 0x10 ^ uVar25) % auVar5;
  uVar22 = auVar5._0_8_;
  uVar12 = uVar22 >> 6 & 0x3ffffff;
  uVar23 = 1L << (auVar5[0] & 0x3f);
  puVar31 = puVar18;
  if (((*(ulong *)((long)__ptr + uVar12 * 8) >> (uVar22 & 0x3f) & 1) != 0) ||
     (uVar22 = *(ulong *)((long)__ptr + uVar12 * 8 + uVar16 * 8), (uVar22 & uVar23) != 0))
  goto LAB_00117d3f;
  *(ulong *)((long)__ptr + uVar12 * 8 + uVar16 * 8) = uVar22 | uVar23;
  puVar30 = puVar30 + 4;
  if (puVar32 <= puVar30) goto LAB_00117e31;
  goto LAB_00117c4b;
LAB_00117d3f:
  puVar20 = (uint *)*puVar31;
  lVar21 = puVar31[1];
  uVar25 = uVar28;
  do {
    uVar26 = 0;
    uVar29 = 0;
    switch(lVar21) {
    case 0:
      goto switchD_00117d8e_caseD_0;
    case 3:
      uVar29 = (uint)*(byte *)((long)puVar20 + 2) << 8;
    case 2:
      uVar26 = uVar29 | (uint)*(byte *)((long)puVar20 + 1) << 0x10;
    case 1:
      uVar25 = (((uint)(byte)*puVar20 << 0x18 | uVar26) * -0x3361d2af >> 0x11 | uVar26 * 0x16a88000)
               * 0x1b873593 ^ uVar25;
      uVar25 = (uVar25 << 0xd | uVar25 >> 0x13) * 5 + 0xe6546b64;
      goto switchD_00117d8e_caseD_0;
    default:
      uVar29 = *puVar20;
      uVar26 = uVar29 >> 0x18 | (uVar29 & 0xff0000) >> 8 | (uVar29 & 0xff00) << 8;
      uVar25 = ((uVar26 | uVar29 << 0x18) * -0x3361d2af >> 0x11 | uVar26 * 0x16a88000) * 0x1b873593
               ^ uVar25;
      uVar25 = (uVar25 << 0xd | uVar25 >> 0x13) * 5 + 0xe6546b64;
      puVar20 = puVar20 + 1;
      lVar21 = lVar21 + -4;
    }
  } while( true );
switchD_00117d8e_caseD_0:
  uVar25 = (uVar25 >> 0x10 ^ uVar25) * -0x7a143595;
  uVar25 = (uVar25 >> 0xd ^ uVar25) * -0x3d4d51cb;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = sVar10;
  auVar6 = ZEXT416(uVar25 >> 0x10 ^ uVar25) % auVar6;
  bVar8 = auVar6[0] & 0x3f;
  puVar2 = (ulong *)((long)__ptr + (auVar6._0_8_ >> 6 & 0x3ffffff) * 8 + uVar16 * 8);
  *puVar2 = *puVar2 & (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
  puVar31 = puVar31 + 4;
  if (puVar32 <= puVar31) goto code_r0x00117e13;
  goto LAB_00117d3f;
code_r0x00117e13:
  uVar19 = uVar19 + 1;
  if (lVar24 < 1) goto LAB_00117e31;
  goto LAB_00117c1b;
switchD_00117ebd_caseD_0:
  uVar25 = (uVar25 >> 0x10 ^ uVar25) * -0x7a143595;
  uVar25 = (uVar25 >> 0xd ^ uVar25) * -0x3d4d51cb;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar10;
  auVar7 = ZEXT416(uVar25 >> 0x10 ^ uVar25) % auVar7;
  puVar2 = (ulong *)((long)__ptr + (auVar7._0_8_ >> 6 & 0x3ffffff) * 8);
  *puVar2 = *puVar2 | 1L << (auVar7[0] & 0x3f);
  puVar30 = puVar30 + 4;
  if (puVar32 <= puVar30) goto LAB_00117f41;
  goto LAB_00117e6e;
}

Assistant:

PHF_PUBLIC int PHF::init(struct phf *phf, const key_t k[], const size_t n, const size_t l, const size_t a, const phf_seed_t seed) {
	size_t n1 = PHF_MAX(n, 1); /* for computations that require n > 0 */
	size_t l1 = PHF_MAX(l, 1);
	size_t a1 = PHF_MAX(PHF_MIN(a, 100), 1);
	size_t r; /* number of buckets */
	size_t m; /* size of output array */
	phf_key<key_t> *B_k = NULL; /* linear bucket-slot array */
	size_t *B_z = NULL;         /* number of slots per bucket */
	phf_key<key_t> *B_p, *B_pe;
	phf_bits_t *T = NULL; /* bitmap to track index occupancy */
	phf_bits_t *T_b;      /* per-bucket working bitmap */
	size_t T_n;
	uint32_t *g = NULL; /* displacement map */
	uint32_t d_max = 0; /* maximum displacement value */
	int error;

	if ((phf->nodiv = nodiv)) {
		/* round to power-of-2 so we can use bit masks instead of modulo division */
		r = phf_powerup(n1 / PHF_MIN(l1, n1));
		m = phf_powerup((n1 * 100) / a1);
	} else {
		r = phf_primeup(PHF_HOWMANY(n1, l1));
		/* XXX: should we bother rounding m to prime number for small n? */
		m = phf_primeup((n1 * 100) / a1);
	}

	if (r == 0 || m == 0)
		return ERANGE;

	if (!(B_k = static_cast<phf_key<key_t> *>(calloc(n1, sizeof *B_k))))
		goto syerr;
	if (!(B_z = static_cast<size_t *>(calloc(r, sizeof *B_z))))
		goto syerr;

	for (size_t i = 0; i < n; i++) {
		phf_hash_t g = phf_g_mod_r<nodiv>(k[i], seed, r);

		B_k[i].k = k[i];
		B_k[i].g = g;
		B_k[i].n = &B_z[g];
		++*B_k[i].n;
	}

	qsort(B_k, n1, sizeof *B_k, reinterpret_cast<int(*)(const void *, const void *)>(&phf_keycmp<key_t>));

	T_n = PHF_HOWMANY(m, PHF_BITS(*T));
	if (!(T = static_cast<phf_bits_t *>(calloc(T_n * 2, sizeof *T))))
		goto syerr;
	T_b = &T[T_n]; /* share single allocation */

	/*
	 * FIXME: T_b[] is unnecessary. We could clear T[] the same way we
	 * clear T_b[]. In fact, at the end of generation T_b[] is identical
	 * to T[] because we don't clear T_b[] on success.
	 *
	 * We just need to tweak the current reset logic to stop before the
	 * key that failed, and then we can elide the commit to T[] at the
	 * end of the outer loop.
	 */

	if (!(g = static_cast<uint32_t *>(calloc(r, sizeof *g))))
		goto syerr;

	B_p = B_k;
	B_pe = &B_k[n];

	for (; B_p < B_pe && *B_p->n > 0; B_p += *B_p->n) {
		phf_key<key_t> *Bi_p, *Bi_pe;
		size_t d = 0;
		uint32_t f;
retry:
		d++;
		Bi_p = B_p;
		Bi_pe = B_p + *B_p->n;

		for (; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);

			if (phf_isset(T, f) || phf_isset(T_b, f)) {
				/* reset T_b[] */
				for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
					f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
					phf_clrbit(T_b, f);
				}

				goto retry;
			} else {
				phf_setbit(T_b, f);
			}
		}

		/* commit to T[] */
		for (Bi_p = B_p; Bi_p < Bi_pe; Bi_p++) {
			f = phf_f_mod_m<nodiv>(d, Bi_p->k, seed, m);
			phf_setbit(T, f);
		}

		/* commit to g[] */
		g[B_p->g] = d;
		d_max = PHF_MAX(d, d_max);
	}

	phf->seed = seed;
	phf->r = r;
	phf->m = m;

	phf->g = g;
	g = NULL;

	phf->d_max = d_max;
	phf->g_op = (nodiv)? phf::PHF_G_UINT32_BAND_R : phf::PHF_G_UINT32_MOD_R;
	phf->g_jmp = NULL;

	error = 0;

	goto clean;
syerr:
	error = errno;
clean:
	free(g);
	free(T);
	free(B_z);
	free(B_k);

	return error;
}